

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void absFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  double local_30;
  double rVal;
  i64 iVal;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  iVar1 = sqlite3_value_type(*argv);
  if (iVar1 == 1) {
    rVal = (double)sqlite3_value_int64(*argv);
    if ((long)rVal < 0) {
      if (rVal == -0.0) {
        sqlite3_result_error(context,"integer overflow",-1);
        return;
      }
      rVal = (double)-(long)rVal;
    }
    sqlite3_result_int64(context,(i64)rVal);
  }
  else if (iVar1 == 5) {
    sqlite3_result_null(context);
  }
  else {
    local_30 = sqlite3_value_double(*argv);
    if (local_30 < 0.0) {
      local_30 = -local_30;
    }
    sqlite3_result_double(context,local_30);
  }
  return;
}

Assistant:

static void absFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_INTEGER: {
      i64 iVal = sqlite3_value_int64(argv[0]);
      if( iVal<0 ){
        if( iVal==SMALLEST_INT64 ){
          /* IMP: R-31676-45509 If X is the integer -9223372036854775808
          ** then abs(X) throws an integer overflow error since there is no
          ** equivalent positive 64-bit two complement value. */
          sqlite3_result_error(context, "integer overflow", -1);
          return;
        }
        iVal = -iVal;
      } 
      sqlite3_result_int64(context, iVal);
      break;
    }
    case SQLITE_NULL: {
      /* IMP: R-37434-19929 Abs(X) returns NULL if X is NULL. */
      sqlite3_result_null(context);
      break;
    }
    default: {
      /* Because sqlite3_value_double() returns 0.0 if the argument is not
      ** something that can be converted into a number, we have:
      ** IMP: R-01992-00519 Abs(X) returns 0.0 if X is a string or blob
      ** that cannot be converted to a numeric value.
      */
      double rVal = sqlite3_value_double(argv[0]);
      if( rVal<0 ) rVal = -rVal;
      sqlite3_result_double(context, rVal);
      break;
    }
  }
}